

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLinearMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               LookupPrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,Vec4 *result)

{
  bool bVar1;
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  int iVar2;
  int iVar3;
  deInt32 dVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  TextureChannelClass TVar8;
  int y0_00;
  int y1_00;
  TextureFormat *pTVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float local_1d4;
  float local_1d0;
  Vector<float,_2> local_18c;
  Vector<float,_2> local_184;
  Vector<float,_2> local_17c;
  Vector<float,_2> local_174;
  float local_16c;
  float local_168;
  float maxB1;
  float minB1;
  float maxA1;
  float minA1;
  int y1_1;
  int y0_1;
  int x1_1;
  int x0_1;
  float searchStep1;
  ColorQuad quad1;
  int i1;
  int j1;
  float maxB0;
  float minB0;
  float maxA0;
  float minA0;
  int y1;
  int y0;
  int x1;
  int x0;
  float searchStep0;
  ColorQuad quad0;
  int i0;
  int j0;
  float cSearchStep;
  TextureChannelClass texClass;
  int maxJ1;
  int minJ1;
  int maxJ0;
  int minJ0;
  int maxI1;
  int minI1;
  int maxI0;
  int minI0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  int h1;
  int h0;
  int w1;
  int w0;
  int coordZ_local;
  Vec2 *coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level1_local;
  ConstPixelBufferAccess *level0_local;
  
  dim = ConstPixelBufferAccess::getWidth(level0);
  dim_00 = ConstPixelBufferAccess::getWidth(level1);
  dim_01 = ConstPixelBufferAccess::getHeight(level0);
  dim_02 = ConstPixelBufferAccess::getHeight(level1);
  bVar1 = sampler->normalizedCoords;
  fVar10 = Vector<float,_2>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,(bool)(bVar1 & 1),dim,fVar10,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar10 = Vector<float,_2>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,(bool)(bVar1 & 1),dim_00,fVar10,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar10 = Vector<float,_2>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,(bool)(bVar1 & 1),dim_01,fVar10,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar10 = Vector<float,_2>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI0,(bool)(bVar1 & 1),dim_02,fVar10,iVar2,iVar3);
  fVar10 = Vector<float,_2>::x(&uBounds1);
  fVar10 = (float)deFloorFloatToInt32(fVar10 - 0.5);
  fVar11 = Vector<float,_2>::y(&uBounds1);
  dVar4 = deFloorFloatToInt32(fVar11 - 0.5);
  fVar11 = Vector<float,_2>::x(&vBounds0);
  fVar11 = (float)deFloorFloatToInt32(fVar11 - 0.5);
  fVar12 = Vector<float,_2>::y(&vBounds0);
  dVar5 = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::x(&vBounds1);
  fVar12 = (float)deFloorFloatToInt32(fVar12 - 0.5);
  fVar13 = Vector<float,_2>::y(&vBounds1);
  dVar6 = deFloorFloatToInt32(fVar13 - 0.5);
  fVar13 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
  fVar13 = (float)deFloorFloatToInt32(fVar13 - 0.5);
  fVar14 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
  dVar7 = deFloorFloatToInt32(fVar14 - 0.5);
  pTVar9 = ConstPixelBufferAccess::getFormat(level0);
  TVar8 = getTextureChannelClass(pTVar9->type);
  quad0.p11.m_data[3] = fVar12;
  if (TVar8 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    local_1d0 = computeBilinearSearchStepForUnorm(prec);
  }
  else {
    if (TVar8 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_1d4 = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      local_1d4 = 0.0;
    }
    local_1d0 = local_1d4;
  }
  do {
    quad0.p11.m_data[2] = fVar10;
    if (dVar6 < (int)quad0.p11.m_data[3]) {
      return false;
    }
    for (; (int)quad0.p11.m_data[2] <= dVar4;
        quad0.p11.m_data[2] = (float)((int)quad0.p11.m_data[2] + 1)) {
      ColorQuad::ColorQuad((ColorQuad *)&x0);
      iVar2 = TexVerifierUtil::wrap(sampler->wrapS,(int)quad0.p11.m_data[2],dim);
      iVar3 = TexVerifierUtil::wrap(sampler->wrapS,(int)quad0.p11.m_data[2] + 1,dim);
      y0_00 = TexVerifierUtil::wrap(sampler->wrapT,(int)quad0.p11.m_data[3],dim_01);
      y1_00 = TexVerifierUtil::wrap(sampler->wrapT,(int)quad0.p11.m_data[3] + 1,dim_01);
      lookupQuad((ColorQuad *)&x0,level0,sampler,iVar2,iVar3,y0_00,y1_00,coordZ);
      if (TVar8 == TEXTURECHANNELCLASS_FLOATING_POINT) {
        x1 = (int)computeBilinearSearchStepFromFloatQuad(prec,(ColorQuad *)&x0);
      }
      else {
        x1 = (int)local_1d0;
      }
      fVar12 = Vector<float,_2>::x(&uBounds1);
      fVar12 = de::clamp<float>((fVar12 - 0.5) - (float)(int)quad0.p11.m_data[2],0.0,1.0);
      fVar14 = Vector<float,_2>::y(&uBounds1);
      fVar14 = de::clamp<float>((fVar14 - 0.5) - (float)(int)quad0.p11.m_data[2],0.0,1.0);
      fVar15 = Vector<float,_2>::x(&vBounds1);
      fVar15 = de::clamp<float>((fVar15 - 0.5) - (float)(int)quad0.p11.m_data[3],0.0,1.0);
      fVar16 = Vector<float,_2>::y(&vBounds1);
      fVar16 = de::clamp<float>((fVar16 - 0.5) - (float)(int)quad0.p11.m_data[3],0.0,1.0);
      for (quad1.p11.m_data[3] = fVar13; fVar17 = fVar11, (int)quad1.p11.m_data[3] <= dVar7;
          quad1.p11.m_data[3] = (float)((int)quad1.p11.m_data[3] + 1)) {
        while (quad1.p11.m_data[2] = fVar17, (int)quad1.p11.m_data[2] <= dVar5) {
          ColorQuad::ColorQuad((ColorQuad *)&x0_1);
          y0_1 = TexVerifierUtil::wrap(sampler->wrapS,(int)quad1.p11.m_data[2],dim_00);
          y1_1 = TexVerifierUtil::wrap(sampler->wrapS,(int)quad1.p11.m_data[2] + 1,dim_00);
          minA1 = (float)TexVerifierUtil::wrap(sampler->wrapT,(int)quad1.p11.m_data[3],dim_02);
          maxA1 = (float)TexVerifierUtil::wrap(sampler->wrapT,(int)quad1.p11.m_data[3] + 1,dim_02);
          lookupQuad((ColorQuad *)&x0_1,level1,sampler,y0_1,y1_1,(int)minA1,(int)maxA1,coordZ);
          if (TVar8 == TEXTURECHANNELCLASS_FLOATING_POINT) {
            x1_1 = (int)computeBilinearSearchStepFromFloatQuad(prec,(ColorQuad *)&x0_1);
          }
          else {
            x1_1 = (int)local_1d0;
          }
          fVar17 = Vector<float,_2>::x(&vBounds0);
          minB1 = de::clamp<float>((fVar17 - 0.5) - (float)(int)quad1.p11.m_data[2],0.0,1.0);
          fVar17 = Vector<float,_2>::y(&vBounds0);
          maxB1 = de::clamp<float>((fVar17 - 0.5) - (float)(int)quad1.p11.m_data[2],0.0,1.0);
          fVar17 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
          local_168 = de::clamp<float>((fVar17 - 0.5) - (float)(int)quad1.p11.m_data[3],0.0,1.0);
          fVar17 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
          local_16c = de::clamp<float>((fVar17 - 0.5) - (float)(int)quad1.p11.m_data[3],0.0,1.0);
          Vector<float,_2>::Vector(&local_174,fVar12,fVar14);
          Vector<float,_2>::Vector(&local_17c,fVar15,fVar16);
          Vector<float,_2>::Vector(&local_184,minB1,maxB1);
          Vector<float,_2>::Vector(&local_18c,local_168,local_16c);
          fVar17 = de::min<float>((float)x1,(float)x1_1);
          bVar1 = is2DTrilinearFilterResultValid
                            (prec,(ColorQuad *)&x0,(ColorQuad *)&x0_1,&local_174,&local_17c,
                             &local_184,&local_18c,fBounds,fVar17,result);
          if (bVar1) {
            return true;
          }
          fVar17 = (float)((int)quad1.p11.m_data[2] + 1);
        }
      }
    }
    quad0.p11.m_data[3] = (float)((int)quad0.p11.m_data[3] + 1);
  } while( true );
}

Assistant:

static bool isLinearMipmapLinearSampleResultValid (const ConstPixelBufferAccess&	level0,
												   const ConstPixelBufferAccess&	level1,
												   const Sampler&					sampler,
												   const LookupPrecision&			prec,
												   const Vec2&						coord,
												   const int						coordZ,
												   const Vec2&						fBounds,
												   const Vec4&						result)
{
	// \todo [2013-07-04 pyry] This is strictly not correct as coordinates between levels should be dependent.
	//						   Right now this allows pairing any two valid bilinear quads.

	const int					w0				= level0.getWidth();
	const int					w1				= level1.getWidth();
	const int					h0				= level0.getHeight();
	const int					h1				= level1.getHeight();

	const Vec2					uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					vBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2					vBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int					minI0			= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int					maxI0			= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int					minI1			= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int					maxI1			= deFloorFloatToInt32(uBounds1.y()-0.5f);
	const int					minJ0			= deFloorFloatToInt32(vBounds0.x()-0.5f);
	const int					maxJ0			= deFloorFloatToInt32(vBounds0.y()-0.5f);
	const int					minJ1			= deFloorFloatToInt32(vBounds1.x()-0.5f);
	const int					maxJ1			= deFloorFloatToInt32(vBounds1.y()-0.5f);

	const TextureChannelClass	texClass		= getTextureChannelClass(level0.getFormat().type);
	const float					cSearchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			ColorQuad	quad0;
			float		searchStep0;

			{
				const int	x0		= wrap(sampler.wrapS, i0  , w0);
				const int	x1		= wrap(sampler.wrapS, i0+1, w0);
				const int	y0		= wrap(sampler.wrapT, j0  , h0);
				const int	y1		= wrap(sampler.wrapT, j0+1, h0);
				lookupQuad(quad0, level0, sampler, x0, x1, y0, y1, coordZ);

				if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
					searchStep0 = computeBilinearSearchStepFromFloatQuad(prec, quad0);
				else
					searchStep0 = cSearchStep;
			}

			const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	minB0	= de::clamp((vBounds0.x()-0.5f)-float(j0), 0.0f, 1.0f);
			const float	maxB0	= de::clamp((vBounds0.y()-0.5f)-float(j0), 0.0f, 1.0f);

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					ColorQuad	quad1;
					float		searchStep1;

					{
						const int	x0		= wrap(sampler.wrapS, i1  , w1);
						const int	x1		= wrap(sampler.wrapS, i1+1, w1);
						const int	y0		= wrap(sampler.wrapT, j1  , h1);
						const int	y1		= wrap(sampler.wrapT, j1+1, h1);
						lookupQuad(quad1, level1, sampler, x0, x1, y0, y1, coordZ);

						if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
							searchStep1 = computeBilinearSearchStepFromFloatQuad(prec, quad1);
						else
							searchStep1 = cSearchStep;
					}

					const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	minB1	= de::clamp((vBounds1.x()-0.5f)-float(j1), 0.0f, 1.0f);
					const float	maxB1	= de::clamp((vBounds1.y()-0.5f)-float(j1), 0.0f, 1.0f);

					if (is2DTrilinearFilterResultValid(prec, quad0, quad1, Vec2(minA0, maxA0), Vec2(minB0, maxB0), Vec2(minA1, maxA1), Vec2(minB1, maxB1),
													   fBounds, de::min(searchStep0, searchStep1), result))
						return true;
				}
			}
		}
	}

	return false;
}